

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void emit_op(JSParseState *s,uint8_t val)

{
  JSFunctionDef *pJVar1;
  
  pJVar1 = s->cur_func;
  if (pJVar1->last_opcode_line_num != s->last_line_num) {
    emit_op_cold_1();
  }
  pJVar1->last_opcode_pos = (int)(pJVar1->byte_code).size;
  dbuf_putc(&pJVar1->byte_code,val);
  return;
}

Assistant:

static void emit_op(JSParseState *s, uint8_t val)
{
    JSFunctionDef *fd = s->cur_func;
    DynBuf *bc = &fd->byte_code;

    /* Use the line number of the last token used, not the next token,
       nor the current offset in the source file.
     */
    if (unlikely(fd->last_opcode_line_num != s->last_line_num)) {
        dbuf_putc(bc, OP_line_num);
        dbuf_put_u32(bc, s->last_line_num);
        fd->last_opcode_line_num = s->last_line_num;
    }
    fd->last_opcode_pos = bc->size;
    dbuf_putc(bc, val);
}